

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O2

bool __thiscall
node::BlockManager::FindUndoPos
          (BlockManager *this,BlockValidationState *state,int nFile,FlatFilePos *pos,uint nAddSize)

{
  uint uVar1;
  pointer pCVar2;
  Notifications *notifications;
  bool bVar3;
  size_t sVar4;
  long in_FS_OFFSET;
  bool out_of_space;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock18;
  bool local_8d;
  int local_8c;
  unique_lock<std::recursive_mutex> local_88;
  bilingual_str local_78;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pos->nFile = nFile;
  local_8c = nFile;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&local_88,&this->cs_LastBlockFile,
             "cs_LastBlockFile",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/blockstorage.cpp"
             ,0x3b4,false);
  pCVar2 = (this->m_blockfile_info).
           super__Vector_base<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar1 = pCVar2[nFile].nUndoSize;
  pos->nPos = uVar1;
  pCVar2[nFile].nUndoSize = uVar1 + nAddSize;
  std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
  _M_insert_unique<int_const&>
            ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
             &this->m_dirty_fileinfo,&local_8c);
  sVar4 = FlatFileSeq::Allocate(&this->m_undo_file_seq,pos,(ulong)nAddSize,&local_8d);
  if (local_8d == true) {
    notifications = (this->m_opts).notifications;
    _(&local_78,(ConstevalStringLiteral)0x68d594);
    bVar3 = FatalError(notifications,state,&local_78);
    bilingual_str::~bilingual_str(&local_78);
  }
  else {
    bVar3 = true;
    if ((sVar4 != 0) && (this->m_prune_mode == true)) {
      this->m_check_for_pruning = true;
    }
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_88);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool BlockManager::FindUndoPos(BlockValidationState& state, int nFile, FlatFilePos& pos, unsigned int nAddSize)
{
    pos.nFile = nFile;

    LOCK(cs_LastBlockFile);

    pos.nPos = m_blockfile_info[nFile].nUndoSize;
    m_blockfile_info[nFile].nUndoSize += nAddSize;
    m_dirty_fileinfo.insert(nFile);

    bool out_of_space;
    size_t bytes_allocated = m_undo_file_seq.Allocate(pos, nAddSize, out_of_space);
    if (out_of_space) {
        return FatalError(m_opts.notifications, state, _("Disk space is too low!"));
    }
    if (bytes_allocated != 0 && IsPruneMode()) {
        m_check_for_pruning = true;
    }

    return true;
}